

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O3

pcp_errno pcp_db_rem_flow(pcp_flow_t *f)

{
  size_t *psVar1;
  pcp_ctx_s *ppVar2;
  pcp_errno pVar3;
  pcp_flow_t *ppVar4;
  pcp_flow_s *ppVar5;
  ulong uVar6;
  pcp_flow_s **pppVar7;
  
  if ((f != (pcp_flow_t *)0x0) && (ppVar2 = f->ctx, ppVar2 != (pcp_ctx_s *)0x0)) {
    uVar6 = (ulong)f->key_bucket;
    pVar3 = PCP_ERR_NOT_FOUND;
    if ((uVar6 != 0xffffffff) &&
       (ppVar5 = (ppVar2->pcp_db).flows[uVar6], ppVar5 != (pcp_flow_t *)0x0)) {
      if (ppVar5 == f) {
        pppVar7 = (ppVar2->pcp_db).flows + uVar6;
      }
      else {
        do {
          ppVar4 = ppVar5;
          ppVar5 = ppVar4->next;
          if (ppVar5 == (pcp_flow_s *)0x0) {
            return PCP_ERR_NOT_FOUND;
          }
        } while (ppVar5 != f);
        pppVar7 = &ppVar4->next;
      }
      ppVar5->key_bucket = 0xffffffff;
      *pppVar7 = ppVar5->next;
      psVar1 = &(ppVar2->pcp_db).flow_cnt;
      *psVar1 = *psVar1 - 1;
      pVar3 = PCP_ERR_SUCCESS;
    }
    return pVar3;
  }
  __assert_fail("f && f->ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/lib/src/pcp_client_db.c"
                ,0xbc,"pcp_errno pcp_db_rem_flow(pcp_flow_t *)");
}

Assistant:

pcp_errno pcp_db_rem_flow(pcp_flow_t *f) {
    pcp_flow_t **fdb = NULL;
    pcp_ctx_t *ctx;

    assert(f && f->ctx);

    if (f->key_bucket == EMPTY) {
        return PCP_ERR_NOT_FOUND;
    }

    ctx = f->ctx;
    PCP_LOG(PCP_LOGLVL_DEBUG, "Removing flow %p, key_bucket %d", f,
            f->key_bucket);

    for (fdb = ctx->pcp_db.flows + f->key_bucket; (*fdb) != NULL;
         fdb = &((*fdb)->next)) {
        if (*fdb == f) {
            (*fdb)->key_bucket = EMPTY;
            (*fdb) = (*fdb)->next;
            ctx->pcp_db.flow_cnt--;
            return PCP_ERR_SUCCESS;
        }
    }

    return PCP_ERR_NOT_FOUND;
}